

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cplusplus_pair.cc
# Opt level: O0

int main(int argc,char **argv)

{
  nng_err nVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ostream *this;
  char local_38 [8];
  char buf [8];
  size_t sz;
  nng_socket local_20;
  nng_err rv;
  nng_socket s2;
  nng_socket s1;
  char **argv_local;
  int argc_local;
  
  _s2 = argv;
  nng_init((nng_init_params *)0x0);
  nVar1 = nng_pair1_open((nng_socket *)&rv);
  if (nVar1 != NNG_OK) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = nng_strerror(nVar1);
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  nVar1 = nng_pair1_open(&local_20);
  if (nVar1 != NNG_OK) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = nng_strerror(nVar1);
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  nVar1 = nng_listen((nng_socket)rv,"inproc://c++",(nng_listener *)0x0,0);
  if (nVar1 != NNG_OK) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = nng_strerror(nVar1);
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  nVar1 = nng_dial(local_20,"inproc://c++",(nng_dialer *)0x0,0);
  if (nVar1 != NNG_OK) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = nng_strerror(nVar1);
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  nVar1 = nng_send(local_20,"ABC",4,0);
  if (nVar1 != NNG_OK) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = nng_strerror(nVar1);
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  buf[0] = '\b';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  nVar1 = nng_recv((nng_socket)rv,local_38,(size_t *)buf,0);
  if (nVar1 != NNG_OK) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = nng_strerror(nVar1);
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  if (buf == (char  [8])0x4) {
    iVar2 = strcmp(local_38,"ABC");
    if (iVar2 == 0) {
      nVar1 = nng_send((nng_socket)rv,"DEF",4,0);
      if (nVar1 != NNG_OK) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = nng_strerror(nVar1);
        *puVar3 = pcVar4;
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      }
      buf[0] = '\b';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      nVar1 = nng_recv(local_20,local_38,(size_t *)buf,0);
      if (nVar1 != NNG_OK) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = nng_strerror(nVar1);
        *puVar3 = pcVar4;
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      }
      if (buf == (char  [8])0x4) {
        iVar2 = strcmp(local_38,"DEF");
        if (iVar2 == 0) {
          nVar1 = nng_socket_close((nng_socket)rv);
          if (nVar1 != NNG_OK) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            pcVar4 = nng_strerror(nVar1);
            *puVar3 = pcVar4;
            __cxa_throw(puVar3,&char_const*::typeinfo,0);
          }
          nVar1 = nng_socket_close(local_20);
          if (nVar1 != NNG_OK) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            pcVar4 = nng_strerror(nVar1);
            *puVar3 = pcVar4;
            __cxa_throw(puVar3,&char_const*::typeinfo,0);
          }
          this = std::operator<<((ostream *)&std::cout,"Pass.");
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          nng_fini();
          return 0;
        }
      }
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "Contents did not match";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Contents did not match";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

int
main(int argc, char **argv)
{

#if defined(NNG_HAVE_PAIR1)

	nng_socket s1;
	nng_socket s2;
	nng_err    rv;
	size_t     sz;
	char       buf[8];
	(void) argc;
	(void) argv;

	nng_init(NULL);
	if ((rv = (nng_err) nng_pair1_open(&s1)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_pair1_open(&s2)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_listen(s1, SOCKET_ADDRESS, NULL, 0)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_dial(s2, SOCKET_ADDRESS, NULL, 0)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_send(s2, (void *) "ABC", 4, 0)) != 0) {
		throw nng_strerror(rv);
	}
	sz = sizeof(buf);
	if ((rv = (nng_err) nng_recv(s1, buf, &sz, 0)) != 0) {
		throw nng_strerror(rv);
	}
	if ((sz != 4) || (std::strcmp(buf, "ABC") != 0)) {
		throw "Contents did not match";
	}
	if ((rv = (nng_err) nng_send(s1, (void *) "DEF", 4, 0)) != 0) {
		throw nng_strerror(rv);
	}
	sz = sizeof(buf);
	if ((rv = (nng_err) nng_recv(s2, buf, &sz, 0)) != 0) {
		throw nng_strerror(rv);
	}
	if ((sz != 4) || (std::strcmp(buf, "DEF") != 0)) {
		throw "Contents did not match";
	}
	if ((rv = (nng_err) nng_socket_close(s1)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_socket_close(s2)) != 0) {
		throw nng_strerror(rv);
	}

	std::cout << "Pass." << std::endl;
	nng_fini();
#else
	(void) argc;
	(void) argv;
	std::cout << "Skipped (protocol unconfigured)." << std::endl;
#endif

	return (0);
}